

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::
       MpRepeatedVarintT<false,unsigned_int,(unsigned_short)512>
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  FieldEntry *pFVar2;
  RepeatedField<unsigned_int> *this;
  ulong uVar3;
  uint *puVar4;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar5;
  ParseContext *extraout_RDX;
  ulong uVar6;
  ParseContext *ctx_00;
  uint32_t *ptr_00;
  char *pcVar7;
  uint32_t next_tag;
  MessageLite *local_48;
  uint64_t local_40;
  TcParseTableBase *local_38;
  
  aVar5 = data.field_0;
  local_40 = hasbits;
  local_38 = table;
  pFVar2 = RefAt<google::protobuf::internal::TcParseTableBase::FieldEntry>
                     (table,(ulong)data.field_0 >> 0x20);
  local_48 = msg;
  this = RefAt<google::protobuf::RepeatedField<unsigned_int>>(msg,(ulong)pFVar2->offset);
  do {
    ptr_00 = (uint32_t *)(long)*ptr;
    if ((long)ptr_00 < 0) {
      uVar3 = (long)ptr[1] << 7 | 0x7f;
      if ((long)uVar3 < 0) {
        aVar5.data = (long)ptr[2] << 0xe | 0x3fff;
        if ((long)aVar5 < 0) {
          uVar3 = uVar3 & ((long)ptr[3] << 0x15 | 0x1fffffU);
          if ((long)uVar3 < 0) {
            aVar5.data = aVar5.data & ((long)ptr[4] << 0x1c | 0xfffffffU);
            if ((long)aVar5.data < 0) {
              uVar3 = uVar3 & ((long)ptr[5] << 0x23 | 0x7ffffffffU);
              if ((long)uVar3 < 0) {
                aVar5.data = aVar5.data & ((long)ptr[6] << 0x2a | 0x3ffffffffffU);
                if ((long)aVar5 < 0) {
                  uVar3 = uVar3 & ((long)ptr[7] << 0x31 | 0x1ffffffffffffU);
                  if ((long)uVar3 < 0) {
                    uVar6 = (ulong)(byte)ptr[8] << 0x38 | 0xffffffffffffff;
                    aVar5.data = aVar5.data & uVar6;
                    if ((long)aVar5 < 0) {
                      bVar1 = ptr[9];
                      ctx_00 = (ParseContext *)CONCAT71((int7)(uVar6 >> 8),bVar1);
                      pcVar7 = ptr + 10;
                      if (bVar1 != 1) {
                        if ((char)bVar1 < '\0') goto LAB_0026cc2b;
                        if ((bVar1 & 1) == 0) {
                          aVar5.data = aVar5.data ^ 0x8000000000000000;
                        }
                      }
                    }
                    else {
                      pcVar7 = ptr + 9;
                    }
                  }
                  else {
                    pcVar7 = ptr + 8;
                  }
                }
                else {
                  pcVar7 = ptr + 7;
                }
              }
              else {
                pcVar7 = ptr + 6;
              }
            }
            else {
              pcVar7 = ptr + 5;
            }
          }
          else {
            pcVar7 = ptr + 4;
          }
        }
        else {
          pcVar7 = ptr + 3;
        }
        uVar3 = uVar3 & aVar5.data;
      }
      else {
        pcVar7 = ptr + 2;
      }
      ptr_00 = (uint32_t *)((ulong)ptr_00 & uVar3);
    }
    else {
      pcVar7 = ptr + 1;
    }
    RepeatedField<unsigned_int>::Add
              (this,-((uint)ptr_00 & 1) ^ (uint)((ulong)ptr_00 >> 1) & 0x7fffffff);
    if ((ctx->super_EpsCopyInputStream).limit_end_ <= pcVar7) break;
    ptr_00 = &next_tag;
    ptr = ReadTag(pcVar7,&next_tag,0);
    ctx_00 = extraout_RDX;
    if (ptr == (char *)0x0) {
LAB_0026cc2b:
      pcVar7 = Error(local_48,(char *)ptr_00,ctx_00,(TcFieldData)aVar5,local_38,local_40);
      return pcVar7;
    }
  } while (next_tag == data.field_0._0_4_);
  if ((ulong)local_38->has_bits_offset != 0) {
    puVar4 = RefAt<unsigned_int>(local_48,(ulong)local_38->has_bits_offset);
    *puVar4 = *puVar4 | (uint)local_40;
  }
  return pcVar7;
}

Assistant:

const char* TcParser::MpRepeatedVarintT(PROTOBUF_TC_PARAM_DECL) {
  const auto& entry = RefAt<FieldEntry>(table, data.entry_offset());
  const uint32_t decoded_tag = data.tag();
  // For is_split we ignore the incoming xform_val and read it from entry to
  // reduce duplication for the uncommon paths.
  const uint16_t xform_val =
      is_split ? (entry.type_card & field_layout::kTvMask) : xform_val_in;
  const bool is_zigzag = xform_val == field_layout::kTvZigZag;
  const bool is_validated_enum = xform_val & field_layout::kTvEnum;

  const char* ptr2 = ptr;
  uint32_t next_tag;
  void* const base = MaybeGetSplitBase(msg, is_split, table);
  auto& field = MaybeCreateRepeatedFieldRefAt<FieldType, is_split>(
      base, entry.offset, msg);

  TcParseTableBase::FieldAux aux;
  if (is_validated_enum) {
    aux = *table->field_aux(&entry);
    PrefetchEnumData(xform_val, aux);
  }

  do {
    uint64_t tmp;
    ptr = ParseVarint(ptr2, &tmp);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) goto error;
    if (is_validated_enum) {
      if (!EnumIsValidAux(static_cast<int32_t>(tmp), xform_val, aux)) {
        ptr = ptr2;
        PROTOBUF_MUSTTAIL return MpUnknownEnumFallback(PROTOBUF_TC_PARAM_PASS);
      }
    } else if (is_zigzag) {
      tmp = sizeof(FieldType) == 8 ? WireFormatLite::ZigZagDecode64(tmp)
                                   : WireFormatLite::ZigZagDecode32(tmp);
    }
    field.Add(static_cast<FieldType>(tmp));
    if (PROTOBUF_PREDICT_FALSE(!ctx->DataAvailable(ptr))) goto parse_loop;
    ptr2 = ReadTag(ptr, &next_tag);
    if (PROTOBUF_PREDICT_FALSE(ptr2 == nullptr)) goto error;
  } while (next_tag == decoded_tag);

parse_loop:
  PROTOBUF_MUSTTAIL return ToParseLoop(PROTOBUF_TC_PARAM_NO_DATA_PASS);
error:
  PROTOBUF_MUSTTAIL return Error(PROTOBUF_TC_PARAM_NO_DATA_PASS);
}